

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void btreeLeaveAll(sqlite3 *db)

{
  int *piVar1;
  Btree *p;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = db->nDb;
  if (0 < iVar2) {
    lVar3 = 8;
    lVar4 = 0;
    do {
      p = *(Btree **)((long)&db->aDb->zDbSName + lVar3);
      if ((p != (Btree *)0x0) && (p->sharable != '\0')) {
        piVar1 = &p->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(p);
          iVar2 = db->nDb;
        }
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (lVar4 < iVar2);
  }
  return;
}

Assistant:

static void SQLITE_NOINLINE btreeLeaveAll(sqlite3 *db){
  int i;
  Btree *p;
  assert( sqlite3_mutex_held(db->mutex) );
  for(i=0; i<db->nDb; i++){
    p = db->aDb[i].pBt;
    if( p ) sqlite3BtreeLeave(p);
  }
}